

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalkExprNN(Walker *pWalker,Expr *pExpr)

{
  Select *p;
  uint uVar1;
  int iVar2;
  int iVar3;
  Expr *pEVar4;
  ExprList **ppEVar5;
  
  do {
    pEVar4 = pExpr;
    uVar1 = (*pWalker->xExprCallback)(pWalker,pEVar4);
    if (uVar1 != 0) {
      return uVar1 & 2;
    }
    if ((pEVar4->flags & 0x810000) != 0) {
      return 0;
    }
    if ((pEVar4->pLeft != (Expr *)0x0) &&
       (iVar2 = sqlite3WalkExprNN(pWalker,pEVar4->pLeft), iVar2 != 0)) {
      return 2;
    }
    pExpr = pEVar4->pRight;
  } while (pEVar4->pRight != (Expr *)0x0);
  uVar1 = pEVar4->flags;
  p = (Select *)(pEVar4->x).pList;
  if ((uVar1 >> 0xc & 1) == 0) {
    if ((p != (Select *)0x0) && (0 < *(int *)p)) {
      ppEVar5 = (ExprList **)&p->iLimit;
      iVar2 = *(int *)p + 1;
      do {
        if (((Expr *)*ppEVar5 != (Expr *)0x0) &&
           (iVar3 = sqlite3WalkExprNN(pWalker,(Expr *)*ppEVar5), iVar3 != 0)) {
          return 2;
        }
        ppEVar5 = ppEVar5 + 3;
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
      uVar1 = pEVar4->flags;
    }
    if ((uVar1 >> 0x18 & 1) == 0) {
      return 0;
    }
    iVar2 = walkWindowList(pWalker,(pEVar4->y).pWin,1);
  }
  else {
    iVar2 = sqlite3WalkSelect(pWalker,p);
  }
  if (iVar2 == 0) {
    return 0;
  }
  return 2;
}

Assistant:

int sqlite3WalkExprNN(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pLeft && sqlite3WalkExprNN(pWalker, pExpr->pLeft) ){
        return WRC_Abort;
      }
      if( pExpr->pRight ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprUseXSelect(pExpr) ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else{
        if( pExpr->x.pList ){
          if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
        }
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pExpr, EP_WinFunc) ){
          if( walkWindowList(pWalker, pExpr->y.pWin, 1) ) return WRC_Abort;
        }
#endif
      }
    }
    break;
  }
  return WRC_Continue;
}